

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

bool __thiscall UniValue::setNumStr(UniValue *this,string *val_)

{
  bool bVar1;
  string *val__local;
  UniValue *this_local;
  
  bVar1 = validNumStr(val_);
  if (bVar1) {
    clear(this);
    this->typ = VNUM;
    std::__cxx11::string::operator=((string *)&this->val,(string *)val_);
  }
  return bVar1;
}

Assistant:

bool UniValue::setNumStr(const std::string& val_)
{
    if (!validNumStr(val_))
        return false;

    clear();
    typ = VNUM;
    val = val_;
    return true;
}